

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O3

void __thiscall
dlib::bn_<(dlib::layer_mode)0>::
forward<dlib::dimpl::subnet_wrapper<dlib::add_layer<dlib::con_<128l,3l,3l,2,2,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<128l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::repeat<3ul,resnet::def<dlib::bn_con>::resbottleneck_64,dlib::add_layer<dlib::max_pool_<3l,3l,2,2,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<64l,7l,7l,2,2,0,0>,dlib::input_rgb_image,void>,void>,void>,void>>,void>,void>,void>,void>,void>,true,void>>
          (bn_<(dlib::layer_mode)0> *this,
          subnet_wrapper<dlib::add_layer<dlib::con_<128L,_3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<128L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::repeat<3UL,_resnet::def<dlib::bn_con>::resbottleneck_64,_dlib::add_layer<dlib::max_pool_<3L,_3L,_2,_2,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<64L,_7L,_7L,_2,_2,_0,_0>,_dlib::input_rgb_image,_void>,_void>,_void>,_void>_>,_void>,_void>,_void>,_void>,_void>,_true,_void>
          *sub,resizable_tensor *output)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 in_ZMM0 [64];
  alias_tensor_instance b;
  alias_tensor_instance g;
  
  auVar2 = in_ZMM0._0_16_;
  alias_tensor::operator()(&g,&this->gamma,(tensor *)this,0);
  alias_tensor::operator()(&b,&this->beta,(tensor *)this,(this->gamma).inst.super_tensor.m_size);
  if ((sub->l->cached_output).super_tensor.m_n < 2) {
    tt::batch_normalize_conv_inference
              (this->eps,output,&(sub->l->cached_output).super_tensor,&g.super_tensor,
               &b.super_tensor,&(this->running_means).super_tensor,
               &(this->running_variances).super_tensor);
  }
  else {
    auVar2 = vcvtusi2sd_avx512f(auVar2,this->num_updates);
    uVar1 = this->num_updates + 1;
    if (this->running_stats_window_size <= uVar1) {
      uVar1 = this->running_stats_window_size;
    }
    this->num_updates = uVar1;
    tt::batch_normalize_conv
              (this->eps,output,&this->means,&this->invstds,
               1.0 - auVar2._0_8_ / (auVar2._0_8_ + 1.0),&this->running_means,
               &this->running_variances,&(sub->l->cached_output).super_tensor,&g.super_tensor,
               &b.super_tensor);
  }
  return;
}

Assistant:

void forward(const SUBNET& sub, resizable_tensor& output)
        {
            auto g = gamma(params,0);
            auto b = beta(params,gamma.size());
            if (sub.get_output().num_samples() > 1)
            {
                const double decay = 1.0 - num_updates/(num_updates+1.0);
                ++num_updates;
                if (num_updates > running_stats_window_size)
                    num_updates = running_stats_window_size;

                if (mode == FC_MODE)
                    tt::batch_normalize(eps, output, means, invstds, decay, running_means, running_variances, sub.get_output(), g, b);
                else 
                    tt::batch_normalize_conv(eps, output, means, invstds, decay, running_means, running_variances, sub.get_output(), g, b);
            }
            else // we are running in testing mode so we just linearly scale the input tensor.
            {
                if (mode == FC_MODE)
                    tt::batch_normalize_inference(eps, output, sub.get_output(), g, b, running_means, running_variances);
                else
                    tt::batch_normalize_conv_inference(eps, output, sub.get_output(), g, b, running_means, running_variances);
            }
        }